

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEN.hpp
# Opt level: O0

void __thiscall ComputerEngineering::ComputerEngineering(ComputerEngineering *this)

{
  ComputerEngineering *this_local;
  
  AbstractMajor::AbstractMajor(&this->super_AbstractMajor);
  (this->super_AbstractMajor)._vptr_AbstractMajor = (_func_int **)&PTR_getName_abi_cxx11__001f7618;
  std::__cxx11::string::operator=((string *)&(this->super_AbstractMajor).name,"cen");
  return;
}

Assistant:

ComputerEngineering() : AbstractMajor() {
            this->name = "cen";
        }